

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcarray.c
# Opt level: O3

LispPTR find_symbol(char *char_base,DLword offset,DLword length,LispPTR hashtbl,DLword fatp,
                   DLword lispp)

{
  int iVar1;
  uint uVar2;
  ushort uVar3;
  DLword *pDVar4;
  ushort uVar5;
  LispPTR array;
  LispPTR datum;
  LispPTR array_00;
  LispPTR datum_00;
  LispPTR LVar6;
  uint uVar7;
  ulong uVar8;
  uint *puVar9;
  uint *puVar10;
  char *char1;
  uint uVar11;
  
  if (hashtbl == 0) {
    return 0xffffffff;
  }
  if (lispp == 0) {
    uVar5 = compute_hash(char_base,offset,length);
  }
  else {
    uVar5 = compute_lisp_hash(char_base,offset,length,fatp);
  }
  uVar3 = length ^ uVar5 ^ uVar5 >> 8;
  if ((hashtbl & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)hashtbl);
  }
  datum = *(LispPTR *)(Lisp_world + hashtbl);
  datum_00 = *(LispPTR *)(Lisp_world + (ulong)hashtbl + 2);
LAB_001225db:
  array = car(datum);
  datum = cdr(datum);
  array_00 = car(datum_00);
  datum_00 = cdr(datum_00);
  if ((array & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)array);
  }
  iVar1 = *(int *)(Lisp_world + (ulong)array + 4);
  if (iVar1 == 0) {
    return 0xffffffff;
  }
  uVar11 = (uint)uVar5;
  do {
    uVar11 = (int)uVar11 % iVar1 & 0xffff;
    LVar6 = aref1(array_00,uVar11);
    if ((LVar6 & 0xff) == ((uint)uVar3 + ((uVar3 >> 1) / 0x7f) * -0xfe + 2 & 0xffff)) {
      LVar6 = aref1(array,uVar11);
      uVar2 = LVar6 & 0xffff;
      if ((LVar6 & 0xfff0000) != 0xe0000) {
        uVar2 = LVar6;
      }
      uVar8 = (ulong)uVar2;
      if ((uVar2 & 0xfff0000) == 0) {
        puVar9 = (uint *)(AtomSpace + (ulong)(uVar2 * 5) * 2);
        puVar10 = puVar9;
      }
      else {
        pDVar4 = Lisp_world;
        if ((uVar2 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
          pDVar4 = Lisp_world;
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
        }
        puVar9 = (uint *)(Lisp_world + uVar8);
        puVar10 = (uint *)(pDVar4 + uVar8);
      }
      if (*(byte *)((ulong)(Lisp_world + (*puVar10 & 0xfffffff)) ^ 3) == length) {
        uVar7 = (uint)((ulong)*(undefined8 *)(puVar9 + 3) >> 0x2d);
        char1 = (char *)((long)(Lisp_world + (*puVar10 & 0xfffffff)) + (ulong)(uVar7 & 1) + 1);
        if (lispp == 0) {
          LVar6 = compare_chars(char1,char_base + ((ulong)offset << (fatp != 0)),length);
        }
        else {
          LVar6 = compare_lisp_chars(char1,char_base + ((ulong)offset << (fatp != 0)),length,
                                     (ushort)uVar7 & 1,fatp);
        }
        if (LVar6 == 1) {
          return uVar2;
        }
      }
    }
    else if ((LVar6 & 0xff) == 0) break;
    uVar11 = uVar11 + ((int)((long)(ulong)(uint)uVar5 % (long)(iVar1 + -2)) + 1U & 0xffff);
  } while( true );
  if (datum_00 == 0) {
    return 0xffffffff;
  }
  goto LAB_001225db;
}

Assistant:

LispPTR find_symbol(const char *char_base, DLword offset, DLword length, LispPTR hashtbl, DLword fatp,
                    DLword lispp)

/* T => the "chars" coming in are 16-bit */
/* T => the incoming chars are in LISP space */
{
  DLword hashval, ehashval, h2, ehash, indexvar;
  int arraylen;
  struct hashtable *hashtbladdr;
#ifdef BIGATOMS
  LispPTR vecs, hashes;
#endif /* BIGATOMS */

  LispPTR vec, hash;
  struct arrayheader *vec68k;
  int fatpnamep;

  if (!hashtbl) return (0xffffffff);

  if (lispp)
    hashval = compute_lisp_hash(char_base, offset, length, fatp);
  else
    hashval = compute_hash(char_base, offset, length);

  ehashval = Entry_hash(length, hashval);
  hashtbladdr = (struct hashtable *)NativeAligned4FromLAddr(hashtbl);

  /* Move our string ptr up by offset, allowing for fatness */
  if (fatp)
    char_base += (offset << 1);
  else
    char_base += offset;

#ifdef BIGATOMS
  vecs = hashtbladdr->table;
  hashes = hashtbladdr->hash;

loop_thru_hashtables:

  vec = car(vecs);
  vecs = cdr(vecs);
  hash = car(hashes);
  hashes = cdr(hashes);
  vec68k = (struct arrayheader *)NativeAligned4FromLAddr(vec);
  arraylen = vec68k->totalsize;
  if (arraylen == 0) return (0xffffffff); /*kludge TAKE*/
  h2 = Rehash_factor(hashval, arraylen);
  indexvar = (hashval % arraylen);
#else
  vec = hashtbladdr->table;
  hash = hashtbladdr->hash;
  vec68k = (struct arrayheader *)NativeAligned4FromLAddr(vec);
  arraylen = vec68k->totalsize;
  if (arraylen == 0) return (0xffffffff); /*kludge TAKE*/
  h2 = Rehash_factor(hashval, arraylen);
  indexvar = (hashval % arraylen);
#endif /* BIGATOMS */

retry:
  /* the aref1 returns a smallp, which is always <256, so trim it */
  while (ehashval != (ehash = 0xFF & aref1(hash, indexvar))) {
    if (ehash == NIL) { /* Ran out of entries in this table; try next or fail */
#ifdef BIGATOMS
      if (hashes == NIL) return (0xffffffff); /* Last table.  Fail. */
      goto loop_thru_hashtables;
#else
      return (0xffffffff);
#endif /* BIGATOMS */
    }
    indexvar = Symbol_hash_reprobe(indexvar, h2, arraylen);
  }
  /*   if ((indexvar&0xffff) != NIL) */
  {
    LispPTR index;
    PNCell *pnptr;
    char *pname_base;

    index = aref1(vec, indexvar);
    if ((index & SEGMASK) == S_POSITIVE) index &= 0xFFFF;

    pnptr = (PNCell *)GetPnameCell(index);
    fatpnamep = ((PLCell *)GetPropCell(index))->fatpnamep;
    pname_base = (char *)NativeAligned2FromLAddr(pnptr->pnamebase);
    if ((length == GETBYTE(pname_base)) &&
        (T == ((lispp) ? compare_lisp_chars((pname_base + 1 + fatpnamep), char_base, length,
                                            fatpnamep, fatp)
                       : compare_chars((pname_base + 1 + fatpnamep), char_base, length)))) {
      return (index);
    } else {
      indexvar = Symbol_hash_reprobe(indexvar, h2, arraylen);
      goto retry;
    }
  }
  /*   else return(0xffffffff); */ /* can't find */
}